

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_poller.cpp
# Opt level: O0

int __thiscall zmq::socket_poller_t::modify_fd(socket_poller_t *this,fd_t fd_,short events_)

{
  bool bVar1;
  iterator b_;
  iterator e_;
  int *piVar2;
  pointer piVar3;
  short in_DX;
  __normal_iterator<zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
  *in_RDI;
  iterator it;
  undefined6 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbe;
  int *in_stack_ffffffffffffffc8;
  __normal_iterator<zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
  local_20;
  short local_16;
  int local_4;
  
  local_16 = in_DX;
  b_ = std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>::
       begin((vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_> *)
             CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8));
  e_ = std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>::end
                 ((vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>
                   *)CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8));
  local_20 = find_if2<__gnu_cxx::__normal_iterator<zmq::socket_poller_t::item_t*,std::vector<zmq::socket_poller_t::item_t,std::allocator<zmq::socket_poller_t::item_t>>>,int,bool(*)(zmq::socket_poller_t::item_t_const&,int)>
                       (b_._M_current,e_._M_current,in_stack_ffffffffffffffc8,
                        (_func_bool_item_t_ptr_int *)in_RDI);
  std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>::end
            ((vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_> *)
             CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8));
  bVar1 = __gnu_cxx::operator==
                    (in_RDI,(__normal_iterator<zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
                             *)CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8));
  if (bVar1) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    local_4 = -1;
  }
  else {
    piVar3 = __gnu_cxx::
             __normal_iterator<zmq::socket_poller_t::item_t_*,_std::vector<zmq::socket_poller_t::item_t,_std::allocator<zmq::socket_poller_t::item_t>_>_>
             ::operator->(&local_20);
    piVar3->events = local_16;
    *(undefined1 *)&in_RDI[5]._M_current = 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int zmq::socket_poller_t::modify_fd (fd_t fd_, short events_)
{
    const items_t::iterator it =
      find_if2 (_items.begin (), _items.end (), fd_, &is_fd);

    if (it == _items.end ()) {
        errno = EINVAL;
        return -1;
    }

    it->events = events_;
    _need_rebuild = true;

    return 0;
}